

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::ElementsAreMatcherBase::
Check<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (AssertionResult *__return_storage_ptr__,ElementsAreMatcherBase *this,int *it,int *end,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers)

{
  AssertionResult *pAVar1;
  type **in_R9;
  int local_68 [4];
  AssertionResult local_58;
  ulong local_30;
  size_t cnt;
  tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
  *matchers_local;
  int *end_local;
  int *it_local;
  
  cnt = (size_t)end;
  matchers_local =
       (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
        *)it;
  end_local = (int *)this;
  it_local = (int *)__return_storage_ptr__;
  local_30 = std::distance<int_const*>((int *)this,it);
  if (local_30 < 4) {
    AssertionFailure();
    pAVar1 = AssertionResult::operator<<(&local_58,(char (*) [23])"ElementsAre: argument[");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_30);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [16])"] is less than ");
    local_68[0] = 4;
    pAVar1 = AssertionResult::operator<<(pAVar1,local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    AssertionResult::~AssertionResult(&local_58);
  }
  else {
    CheckElem<0,3,int_const*,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
              (__return_storage_ptr__,(ElementsAreMatcherBase *)end_local,(int *)matchers_local,
               (int *)cnt,
               (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
                *)&iutest_type_traits::enabler_t<void>::value,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Check(Ite it, Ite end, M& matchers)
    {
        const size_t cnt = ::std::distance(it, end);
        if IUTEST_COND_UNLIKELY( cnt < LAST+1 )
        {
            return AssertionFailure() << "ElementsAre: argument[" << cnt << "] is less than " << LAST+1;
        }